

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TikzPlotter.cpp
# Opt level: O2

void __thiscall vectorgraphics::TikzPlotter::addPoint(TikzPlotter *this,Point2D *point_2d)

{
  _Rb_tree_header *p_Var1;
  pointer psVar2;
  Style *this_00;
  bool bVar3;
  iterator iVar4;
  ostream *poVar5;
  pointer psVar6;
  long lVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  allocator_type local_1fa;
  allocator<char> local_1f9;
  allocator<char> local_1f8;
  allocator_type local_1f7;
  allocator<char> local_1f6;
  allocator<char> local_1f5;
  allocator<char> local_1f4;
  allocator<char> local_1f3;
  allocator<char> local_1f2;
  allocator<char> local_1f1;
  TikzPlotter *local_1f0;
  StyleMap style_map;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a0;
  key_type local_188;
  string local_168 [32];
  string local_148;
  string local_128;
  vector<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
  local_108;
  key_type local_f0;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  style_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &style_map._M_t._M_impl.super__Rb_tree_header._M_header;
  style_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  style_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  style_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  psVar2 = (point_2d->super_Primitive).style_ptrs.
           super__Vector_base<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1f0 = this;
  style_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       style_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (psVar6 = (point_2d->super_Primitive).style_ptrs.
                super__Vector_base<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar2; psVar6 = psVar6 + 1) {
    this_00 = (psVar6->super___shared_ptr<vectorgraphics::Style,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    std::
    vector<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
    ::vector(&local_108,
             (vector<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
              *)point_2d);
    bVar3 = Style::conditionFulfilled(this_00,&local_108);
    std::
    vector<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
    ::~vector(&local_108);
    if (bVar3) {
      Style::applyStyle((psVar6->
                        super___shared_ptr<vectorgraphics::Style,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr,&style_map);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"draw",(allocator<char> *)&local_128);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&style_map._M_t,&local_f0);
  p_Var1 = &style_map._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar4._M_node == p_Var1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_188,"fill",(allocator<char> *)&local_148);
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&style_map._M_t,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_f0);
    if ((_Rb_tree_header *)iVar4._M_node == p_Var1) goto LAB_00105a21;
  }
  else {
    std::__cxx11::string::~string((string *)&local_f0);
  }
  poVar5 = std::operator<<((ostream *)&local_1f0->field_0x10,"\\path[");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"draw",&local_1f1);
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"draw opacity",&local_1f2);
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"fill",&local_1f3);
  std::__cxx11::string::string<std::allocator<char>>(local_90,"fill opacity",&local_1f4);
  std::__cxx11::string::string<std::allocator<char>>(local_70,"line width",&local_1f5);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"*point_path",&local_1f6);
  __l._M_len = 6;
  __l._M_array = &local_f0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1a0,__l,&local_1f7);
  getStyleMapString(&local_128,&style_map,&local_1a0);
  poVar5 = std::operator<<(poVar5,(string *)&local_128);
  poVar5 = std::operator<<(poVar5,"] ");
  poVar5 = operator<<(poVar5,point_2d);
  poVar5 = std::operator<<(poVar5,"circle [");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"radius",&local_1f8);
  std::__cxx11::string::string<std::allocator<char>>(local_168,"*point_circle",&local_1f9);
  __l_00._M_len = 2;
  __l_00._M_array = &local_188;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1b8,__l_00,&local_1fa);
  getStyleMapString(&local_148,&style_map,&local_1b8);
  poVar5 = std::operator<<(poVar5,(string *)&local_148);
  poVar5 = std::operator<<(poVar5,"];");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::string::~string((string *)&local_148);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b8);
  lVar7 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_188._M_dataplus._M_p + lVar7));
    lVar7 = lVar7 + -0x20;
  } while (lVar7 != -0x20);
  std::__cxx11::string::~string((string *)&local_128);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1a0);
  lVar7 = 0xa0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_f0._M_dataplus._M_p + lVar7));
    lVar7 = lVar7 + -0x20;
  } while (lVar7 != -0x20);
LAB_00105a21:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&style_map._M_t);
  return;
}

Assistant:

void TikzPlotter::addPoint(const Point2D &point_2d) {
    StyleMap style_map;

    // check which styles apply
    for(const auto& style_ptr : point_2d.style_ptrs) {
      if(style_ptr->conditionFulfilled(point_2d.flag_ptrs)) {
        style_ptr->applyStyle(style_map);
      }
    }

    // add the point based on style_map final state
    if(style_map.find("draw") != style_map.end() || style_map.find("fill") != style_map.end()) {
      content << R"(\path[)" 
        << getStyleMapString(style_map, {"draw", "draw opacity", "fill", "fill opacity", "line width", "*point_path"})
        << "] " 
        << point_2d 
        << "circle [" 
        << getStyleMapString(style_map, {"radius", "*point_circle"})
        << "];" 
        << std::endl;
    }
  }